

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::SplitProgramFromArgs(string *command,string *program,string *args)

{
  char *pcVar1;
  char ch;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  char *pcVar6;
  
  pcVar6 = (command->_M_dataplus)._M_p + -1;
  do {
    pcVar1 = pcVar6 + 1;
    pcVar6 = pcVar6 + 1;
    bVar3 = cmIsSpace(*pcVar1);
  } while (bVar3);
  bVar2 = false;
  bVar5 = false;
  bVar3 = false;
  do {
    ch = *pcVar6;
    if (ch == '\0') {
      std::__cxx11::string::assign((char *)args);
      if (!bVar3) {
LAB_002cff6c:
        if (!bVar2) {
          return (bool)(bVar5 ^ 1);
        }
      }
      return false;
    }
    if (bVar3) {
      if (ch != '\'') goto LAB_002cff29;
      bVar3 = false;
    }
    else if (bVar2) {
      std::__cxx11::string::push_back((char)program);
      bVar2 = false;
    }
    else if (ch == '\\') {
      bVar2 = true;
    }
    else if (bVar5) {
      if (ch == '\"') {
        bVar5 = false;
      }
      else {
LAB_002cff29:
        std::__cxx11::string::push_back((char)program);
      }
    }
    else if (ch == '\"') {
      bVar5 = true;
    }
    else {
      if (ch != '\'') {
        bVar4 = cmIsSpace(ch);
        if (!bVar4) goto LAB_002cff29;
        std::__cxx11::string::assign((char *)args);
        goto LAB_002cff6c;
      }
      bVar3 = true;
    }
    pcVar6 = pcVar6 + 1;
  } while( true );
}

Assistant:

bool cmSystemTools::SplitProgramFromArgs(std::string const& command,
                                         std::string& program,
                                         std::string& args)
{
  const char* c = command.c_str();

  // Skip leading whitespace.
  while (cmIsSpace(*c)) {
    ++c;
  }

  // Parse one command-line element up to an unquoted space.
  bool in_escape = false;
  bool in_double = false;
  bool in_single = false;
  for (; *c; ++c) {
    if (in_single) {
      if (*c == '\'') {
        in_single = false;
      } else {
        program += *c;
      }
    } else if (in_escape) {
      in_escape = false;
      program += *c;
    } else if (*c == '\\') {
      in_escape = true;
    } else if (in_double) {
      if (*c == '"') {
        in_double = false;
      } else {
        program += *c;
      }
    } else if (*c == '"') {
      in_double = true;
    } else if (*c == '\'') {
      in_single = true;
    } else if (cmIsSpace(*c)) {
      break;
    } else {
      program += *c;
    }
  }

  // The remainder of the command line holds unparsed arguments.
  args = c;

  return !in_single && !in_escape && !in_double;
}